

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uniforms.cpp
# Opt level: O1

void __thiscall UniformFunction::UniformFunction(UniformFunction *this)

{
  (this->print).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->print)._M_invoker = (_Invoker_type)0x0;
  *(undefined8 *)&(this->print).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->print).super__Function_base._M_functor + 8) = 0;
  (this->assign).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->assign)._M_invoker = (_Invoker_type)0x0;
  *(undefined8 *)&(this->assign).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->assign).super__Function_base._M_functor + 8) = 0;
  (this->type)._M_dataplus._M_p = (pointer)&(this->type).field_2;
  (this->type)._M_string_length = 0;
  (this->type).field_2._M_local_buf[0] = '\0';
  this->present = false;
  std::__cxx11::string::_M_replace((ulong)&this->type,0,(char *)0x0,0x2f241d);
  return;
}

Assistant:

UniformFunction::UniformFunction() {
    type = "-undefined-";
}